

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf16collationiterator.cpp
# Opt level: O0

uint32_t __thiscall
icu_63::FCDUTF16CollationIterator::handleNextCE32
          (FCDUTF16CollationIterator *this,UChar32 *c,UErrorCode *errorCode)

{
  UChar *pUVar1;
  UBool UVar2;
  UErrorCode *errorCode_local;
  UChar32 *c_local;
  FCDUTF16CollationIterator *this_local;
  
  do {
    if ('\0' < this->checkDir) {
      if ((this->super_UTF16CollationIterator).pos == (this->super_UTF16CollationIterator).limit) {
        *c = -1;
        this_local._4_4_ = 0xc0;
      }
      else {
        pUVar1 = (this->super_UTF16CollationIterator).pos;
        (this->super_UTF16CollationIterator).pos = pUVar1 + 1;
        *c = (uint)(ushort)*pUVar1;
        UVar2 = CollationFCD::hasTccc(*c);
        if ((UVar2 != '\0') &&
           ((UVar2 = CollationFCD::maybeTibetanCompositeVowel(*c), UVar2 != '\0' ||
            (((this->super_UTF16CollationIterator).pos != (this->super_UTF16CollationIterator).limit
             && (UVar2 = CollationFCD::hasLccc
                                   ((uint)(ushort)*(this->super_UTF16CollationIterator).pos),
                UVar2 != '\0')))))) {
          (this->super_UTF16CollationIterator).pos = (this->super_UTF16CollationIterator).pos + -1;
          UVar2 = nextSegment(this,errorCode);
          if (UVar2 == '\0') {
            *c = -1;
            return 0xc0;
          }
          pUVar1 = (this->super_UTF16CollationIterator).pos;
          (this->super_UTF16CollationIterator).pos = pUVar1 + 1;
          *c = (uint)(ushort)*pUVar1;
        }
LAB_0029ed60:
        this_local._4_4_ =
             ((this->super_UTF16CollationIterator).super_CollationIterator.trie)->data32
             [(int)((uint)((this->super_UTF16CollationIterator).super_CollationIterator.trie)->index
                          [*c >> 5] * 4 + (*c & 0x1fU))];
      }
      return this_local._4_4_;
    }
    if ((this->checkDir == '\0') &&
       ((this->super_UTF16CollationIterator).pos != (this->super_UTF16CollationIterator).limit)) {
      pUVar1 = (this->super_UTF16CollationIterator).pos;
      (this->super_UTF16CollationIterator).pos = pUVar1 + 1;
      *c = (uint)(ushort)*pUVar1;
      goto LAB_0029ed60;
    }
    switchToForward(this);
  } while( true );
}

Assistant:

uint32_t
FCDUTF16CollationIterator::handleNextCE32(UChar32 &c, UErrorCode &errorCode) {
    for(;;) {
        if(checkDir > 0) {
            if(pos == limit) {
                c = U_SENTINEL;
                return Collation::FALLBACK_CE32;
            }
            c = *pos++;
            if(CollationFCD::hasTccc(c)) {
                if(CollationFCD::maybeTibetanCompositeVowel(c) ||
                        (pos != limit && CollationFCD::hasLccc(*pos))) {
                    --pos;
                    if(!nextSegment(errorCode)) {
                        c = U_SENTINEL;
                        return Collation::FALLBACK_CE32;
                    }
                    c = *pos++;
                }
            }
            break;
        } else if(checkDir == 0 && pos != limit) {
            c = *pos++;
            break;
        } else {
            switchToForward();
        }
    }
    return UTRIE2_GET32_FROM_U16_SINGLE_LEAD(trie, c);
}